

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

LR des_round(LR in,des_keysched *sched,size_t round)

{
  LR LVar1;
  uint32_t uVar2;
  size_t round_local;
  des_keysched *sched_local;
  LR in_local;
  LR out;
  
  sched_local._4_4_ = in.R;
  sched_local._0_4_ = in.L;
  uVar2 = des_f(sched_local._4_4_,sched->k7531[round],sched->k6420[round]);
  LVar1.R = (uint)sched_local ^ uVar2;
  LVar1.L = sched_local._4_4_;
  return LVar1;
}

Assistant:

static inline LR des_round(LR in, const des_keysched *sched, size_t round)
{
    LR out;
    out.L = in.R;
    out.R = in.L ^ des_f(in.R, sched->k7531[round], sched->k6420[round]);
    return out;
}